

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmGlobalUnixMakefileGenerator3::InitializeProgressMarks(cmGlobalUnixMakefileGenerator3 *this)

{
  pointer puVar1;
  pointer puVar2;
  bool bVar3;
  cmLocalGenerator *pcVar4;
  _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
  *this_00;
  TargetDependSet *pTVar5;
  _Rb_tree_node_base *p_Var6;
  pointer puVar7;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *gt;
  pointer puVar8;
  cmStateSnapshot csnp;
  cmStateSnapshot tsnp;
  cmStateSnapshot local_80;
  cmStateSnapshot local_68;
  cmStateSnapshot local_48;
  
  std::
  _Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>,_std::_Select1st<std::pair<const_cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
  ::clear(&(this->DirectoryTargetsMap)._M_t);
  puVar7 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
           super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
           super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar7 != puVar1) {
    do {
      pcVar4 = (puVar7->_M_t).
               super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t.
               super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
               super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
      puVar2 = *(pointer *)
                ((long)&(pcVar4->GeneratorTargets).
                        super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                + 8);
      for (puVar8 = *(pointer *)
                     &(pcVar4->GeneratorTargets).
                      super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                      ._M_impl; puVar8 != puVar2; puVar8 = puVar8 + 1) {
        pcVar4 = cmGeneratorTarget::GetLocalGenerator
                           ((cmGeneratorTarget *)
                            (puVar8->_M_t).
                            super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                           );
        bVar3 = cmGeneratorTarget::IsInBuildSystem
                          ((cmGeneratorTarget *)
                           (puVar8->_M_t).
                           super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                          );
        if ((bVar3) &&
           (bVar3 = cmGlobalGenerator::IsExcluded
                              ((cmGlobalGenerator *)this,
                               (puVar7->_M_t).
                               super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                               .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl,
                               (cmGeneratorTarget *)
                               (puVar8->_M_t).
                               super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                              ), !bVar3)) {
          cmLocalGenerator::GetStateSnapshot
                    (&local_68,
                     (puVar7->_M_t).
                     super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                     .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl);
          cmLocalGenerator::GetStateSnapshot(&local_48,pcVar4);
          while ((bVar3 = cmStateSnapshot::IsValid(&local_68), bVar3 &&
                 (bVar3 = cmGlobalGenerator::IsExcluded
                                    ((cmGlobalGenerator *)this,&local_68,&local_48), !bVar3))) {
            this_00 = (_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                       *)std::
                         map<cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
                         ::operator[](&this->DirectoryTargetsMap,&local_68);
            local_80.State =
                 *(cmState **)
                  &(puVar8->_M_t).
                   super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
            ;
            std::
            _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
            ::_M_insert_unique<cmGeneratorTarget_const*>(this_00,(cmGeneratorTarget **)&local_80);
            pTVar5 = cmGlobalGenerator::GetTargetDirectDepends
                               ((cmGlobalGenerator *)this,
                                (cmGeneratorTarget *)
                                (puVar8->_M_t).
                                super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                               );
            for (p_Var6 = (pTVar5->
                          super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                          )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                (_Rb_tree_header *)p_Var6 !=
                &(pTVar5->
                 super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                 )._M_t._M_impl.super__Rb_tree_header;
                p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
              local_80.State = *(cmState **)(p_Var6 + 1);
              std::
              _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
              ::_M_insert_unique<cmGeneratorTarget_const*>(this_00,(cmGeneratorTarget **)&local_80);
            }
            cmStateSnapshot::GetBuildsystemDirectoryParent(&local_80,&local_68);
            local_68.State = local_80.State;
          }
        }
      }
      puVar7 = puVar7 + 1;
    } while (puVar7 != puVar1);
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::InitializeProgressMarks()
{
  this->DirectoryTargetsMap.clear();
  // Loop over all targets in all local generators.
  for (const auto& lg : this->LocalGenerators) {
    for (const auto& gt : lg->GetGeneratorTargets()) {
      cmLocalGenerator* tlg = gt->GetLocalGenerator();

      if (!gt->IsInBuildSystem() || this->IsExcluded(lg.get(), gt.get())) {
        continue;
      }

      cmStateSnapshot csnp = lg->GetStateSnapshot();
      cmStateSnapshot tsnp = tlg->GetStateSnapshot();

      // Consider the directory containing the target and all its
      // parents until something excludes the target.
      for (; csnp.IsValid() && !this->IsExcluded(csnp, tsnp);
           csnp = csnp.GetBuildsystemDirectoryParent()) {
        // This local generator includes the target.
        std::set<cmGeneratorTarget const*>& targetSet =
          this->DirectoryTargetsMap[csnp];
        targetSet.insert(gt.get());

        // Add dependencies of the included target.  An excluded
        // target may still be included if it is a dependency of a
        // non-excluded target.
        for (cmTargetDepend const& tgtdep :
             this->GetTargetDirectDepends(gt.get())) {
          targetSet.insert(tgtdep);
        }
      }
    }
  }
}